

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O3

int construct(huffman *h,short *length,int n)

{
  short *psVar1;
  int iVar2;
  uint in_ECX;
  undefined4 in_register_00000014;
  uint uVar3;
  long lVar4;
  short sVar5;
  ulong uVar6;
  short offs [16];
  
  h[1].count = (short *)0x0;
  h[1].symbol = (short *)0x0;
  h->count = (short *)0x0;
  h->symbol = (short *)0x0;
  iVar2 = 0;
  uVar3 = 0;
  if (0 < (int)in_ECX) {
    uVar6 = 0;
    do {
      psVar1 = (short *)((long)&h->count +
                        (long)*(short *)(CONCAT44(in_register_00000014,n) + uVar6 * 2) * 2);
      *psVar1 = *psVar1 + 1;
      uVar6 = uVar6 + 1;
    } while (in_ECX != uVar6);
    uVar3 = (uint)*(short *)&h->count;
  }
  if (uVar3 != in_ECX) {
    iVar2 = 1;
    lVar4 = 1;
    do {
      iVar2 = iVar2 * 2 - (int)*(short *)((long)&h->count + lVar4 * 2);
      if (iVar2 < 0) {
        return iVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    offs[1] = 0;
    lVar4 = 0;
    sVar5 = 0;
    do {
      sVar5 = sVar5 + *(short *)((long)&h->count + lVar4 * 2 + 2);
      offs[lVar4 + 2] = sVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xe);
    if (0 < (int)in_ECX) {
      uVar6 = 0;
      do {
        lVar4 = (long)*(short *)(CONCAT44(in_register_00000014,n) + uVar6 * 2);
        if (lVar4 != 0) {
          sVar5 = offs[lVar4];
          offs[lVar4] = sVar5 + 1;
          length[sVar5] = (short)uVar6;
        }
        uVar6 = uVar6 + 1;
      } while (in_ECX != uVar6);
    }
  }
  return iVar2;
}

Assistant:

local int construct(struct huffman *h, const short *length, int n)
{
    int symbol;         /* current symbol when stepping through length[] */
    int len;            /* current length when stepping through h->count[] */
    int left;           /* number of possible codes left of current length */
    short offs[MAXBITS+1];      /* offsets in symbol table for each length */

    /* count number of codes of each length */
    for (len = 0; len <= MAXBITS; len++)
        h->count[len] = 0;
    for (symbol = 0; symbol < n; symbol++)
        (h->count[length[symbol]])++;   /* assumes lengths are within bounds */
    if (h->count[0] == n)               /* no codes! */
        return 0;                       /* complete, but decode() will fail */

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;                           /* one possible code of zero length */
    for (len = 1; len <= MAXBITS; len++) {
        left <<= 1;                     /* one more bit, double codes left */
        left -= h->count[len];          /* deduct count from possible codes */
        if (left < 0)
            return left;                /* over-subscribed--return negative */
    }                                   /* left > 0 means incomplete */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAXBITS; len++)
        offs[len + 1] = offs[len] + h->count[len];

    /*
     * put symbols in table sorted by length, by symbol order within each
     * length
     */
    for (symbol = 0; symbol < n; symbol++)
        if (length[symbol] != 0)
            h->symbol[offs[length[symbol]]++] = symbol;

    /* return zero for complete set, positive for incomplete set */
    return left;
}